

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utfcvutils.h
# Opt level: O3

tuple<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 utf32toutf8<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            src,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                send,
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           dst,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               dend)

{
  wchar_t wVar1;
  byte *in_R8;
  byte bVar2;
  tuple<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar3;
  
  if (send._M_current < dst._M_current) {
    do {
      wVar1 = *send._M_current;
      bVar2 = (byte)wVar1;
      if ((uint)wVar1 < 0x80) {
        if (in_R8 < (byte *)dend._M_current + 1) break;
        *dend._M_current = bVar2;
        dend._M_current = (char *)((byte *)dend._M_current + 1);
      }
      else if ((uint)wVar1 < 0x800) {
        if (in_R8 < (byte *)dend._M_current + 2) break;
        *dend._M_current = (byte)((uint)wVar1 >> 6) | 0xc0;
        ((byte *)dend._M_current)[1] = bVar2 & 0x3f | 0x80;
        dend._M_current = (char *)((byte *)dend._M_current + 2);
      }
      else if ((uint)wVar1 < 0x10000) {
        if (((wVar1 & 0xf800U) == 0xd800) || (in_R8 < (byte *)dend._M_current + 3)) break;
        *dend._M_current = (byte)((uint)wVar1 >> 0xc) | 0xe0;
        ((byte *)dend._M_current)[1] = (byte)((uint)wVar1 >> 6) & 0x3f | 0x80;
        ((byte *)dend._M_current)[2] = bVar2 & 0x3f | 0x80;
        dend._M_current = (char *)((byte *)dend._M_current + 3);
      }
      else {
        if ((0x10ffff < (uint)wVar1) || (in_R8 < (byte *)dend._M_current + 4)) break;
        *dend._M_current = (byte)((uint)wVar1 >> 0x12) | 0xf0;
        ((byte *)dend._M_current)[1] = (byte)((uint)wVar1 >> 0xc) & 0x3f | 0x80;
        ((byte *)dend._M_current)[2] = (byte)((uint)wVar1 >> 6) & 0x3f | 0x80;
        ((byte *)dend._M_current)[3] = bVar2 & 0x3f | 0x80;
        dend._M_current = (char *)((byte *)dend._M_current + 4);
      }
      send._M_current = send._M_current + 1;
    } while (send._M_current < dst._M_current);
  }
  *(char **)src._M_current = dend._M_current;
  *(wchar_t **)(src._M_current + 2) = send._M_current;
  tVar3.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_false>
  ._M_head_impl._M_current =
       (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        )(__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          )dst._M_current;
  tVar3.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_current =
       (_Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        )(_Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          )src._M_current;
  return (tuple<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )tVar3.
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
}

Assistant:

auto utf32toutf8(S src, S send, D dst, D dend)
{
    while (src < send)
    {
        uint32_t c = *src;
        if (c<0x80) {
            if (dst+1 > dend)
                break;
            *dst++ = c;
        }
        else if (c<0x800) {
            if (dst+2 > dend)
                break;
            *dst++ = 0xc0 + (c>>6);
            *dst++ = 0x80 + (c&0x3f);
        }
        else if (c<0x10000) {
            // break on invalid codes
            if (c>=0xd800 && c<0xe000)
                break;

            if (dst+3 > dend)
                break;
            *dst++ = 0xe0 + (c>>12);
            *dst++ = 0x80 + ((c>>6)&0x3f);
            *dst++ = 0x80 + (c&0x3f);
        }
        else if (c<0x110000) {
            if (dst+4 > dend)
                break;
            *dst++ = 0xf0 + (c>>18);
            *dst++ = 0x80 + ((c>>12)&0x3f);
            *dst++ = 0x80 + ((c>>6)&0x3f);
            *dst++ = 0x80 + (c&0x3f);
        }
        else {
            // break on invalid codes
            break;
        }

        ++src;
    }
    return std::make_tuple(src, dst);
}